

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char **ppcVar1;
  FILE *pFVar2;
  byte bVar3;
  bool bVar4;
  char *pcVar5;
  bool bVar6;
  bool failed;
  ulong uStack_68;
  uint8_t maxLen;
  unsigned_long tmp_3;
  char *endptr_3;
  unsigned_long tmp_2;
  char *endptr_2;
  unsigned_long tmp_1;
  char *endptr_1;
  unsigned_long tmp;
  char *endptr;
  uint local_1c;
  char **ppcStack_18;
  int ch;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  nbErrors = '\0';
  ppcStack_18 = argv;
  argv_local._0_4_ = argc;
  while (local_1c = musl_getopt_long_only((int)argv_local,ppcStack_18,optstring,longopts,(int *)0x0)
        , local_1c != 0xffffffff) {
    switch(local_1c) {
    case 0x43:
    case 99:
      model = CGB;
      if (local_1c == 99) {
        model = BOTH;
      }
      if (0xf < titleLen) {
        titleLen = '\x0f';
        fprintf(_stderr,"warning: Truncating title \"%s\" to 15 chars\n",title);
      }
      break;
    default:
      fprintf(_stderr,"FATAL: unknown option \'%c\'\n",(ulong)local_1c);
      printUsage();
      exit(1);
    case 0x4f:
      overwriteRom = true;
      break;
    case 0x56:
      pcVar5 = get_package_version_string();
      printf("rgbfix %s\n",pcVar5);
      exit(0);
    case 0x66:
      fixSpec = '\0';
      for (; *musl_optarg != '\0'; musl_optarg = musl_optarg + 1) {
        switch(*musl_optarg) {
        case 'G':
          if ((fixSpec & 8) != 0) {
            fprintf(_stderr,"warning: \'G\' overriding \'g\' in fix spec\n");
          }
          fixSpec = fixSpec & 0xf7 | 4;
          break;
        case 'H':
          if ((fixSpec & 0x20) != 0) {
            fprintf(_stderr,"warning: \'H\' overriding \'h\' in fix spec\n");
          }
          fixSpec = fixSpec & 0xdf | 0x10;
          break;
        default:
          fprintf(_stderr,"warning: Ignoring \'%c\' in fix spec\n",(ulong)(uint)(int)*musl_optarg);
          break;
        case 'L':
          if ((fixSpec & 0x80) != 0) {
            fprintf(_stderr,"warning: \'L\' overriding \'l\' in fix spec\n");
          }
          fixSpec = fixSpec & 0x7f | 0x40;
          break;
        case 'g':
          if ((fixSpec & 4) != 0) {
            fprintf(_stderr,"warning: \'g\' overriding \'G\' in fix spec\n");
          }
          fixSpec = fixSpec & 0xfb | 8;
          break;
        case 'h':
          if ((fixSpec & 0x10) != 0) {
            fprintf(_stderr,"warning: \'h\' overriding \'H\' in fix spec\n");
          }
          fixSpec = fixSpec & 0xef | 0x20;
          break;
        case 'l':
          if ((fixSpec & 0x40) != 0) {
            fprintf(_stderr,"warning: \'l\' overriding \'L\' in fix spec\n");
          }
          fixSpec = fixSpec & 0xbf | 0x80;
        }
      }
      break;
    case 0x69:
      gameID = musl_optarg;
      endptr = (char *)strlen(musl_optarg);
      if ((char *)0x4 < endptr) {
        endptr = (char *)0x4;
        fprintf(_stderr,"warning: Truncating game ID \"%s\" to 4 chars\n",gameID);
      }
      gameIDLen = (uint8_t)endptr;
      if (0xb < titleLen) {
        titleLen = '\v';
        fprintf(_stderr,"warning: Truncating title \"%s\" to 11 chars\n",title);
      }
      break;
    case 0x6a:
      japanese = false;
      break;
    case 0x6b:
      newLicensee = musl_optarg;
      endptr = (char *)strlen(musl_optarg);
      if ((char *)0x2 < endptr) {
        endptr = (char *)0x2;
        fprintf(_stderr,"warning: Truncating new licensee \"%s\" to 2 chars\n",newLicensee);
      }
      newLicenseeLen = (uint8_t)endptr;
      break;
    case 0x6c:
      if (*musl_optarg == '\0') {
        report("error: Argument to option \'l\' may not be empty\n");
      }
      else {
        if (*musl_optarg == '$') {
          endptr_1 = (char *)strtoul(musl_optarg + 1,(char **)&tmp,0x10);
        }
        else {
          endptr_1 = (char *)strtoul(musl_optarg,(char **)&tmp,0);
        }
        if (*(char *)tmp == '\0') {
          if (endptr_1 < (char *)0x100) {
            oldLicensee = (uint16_t)endptr_1;
          }
          else {
            report("error: Argument to option \'l\' is larger than 255: %lu\n",endptr_1);
          }
        }
        else {
          report("error: Expected number as argument to option \'l\', got %s\n",musl_optarg);
        }
      }
      break;
    case 0x6d:
      cartridgeType = parseMBC(musl_optarg);
      if (cartridgeType == MBC_BAD) {
        report("error: Unknown MBC \"%s\"\nAccepted MBC names:\n",musl_optarg);
        printAcceptedMBCNames();
      }
      else if (cartridgeType == MBC_WRONG_FEATURES) {
        report("error: Features incompatible with MBC (\"%s\")\nAccepted combinations:\n",
               musl_optarg);
        printAcceptedMBCNames();
      }
      else if (cartridgeType == MBC_BAD_RANGE) {
        report("error: Specified MBC ID out of range 0-255: %s\n",musl_optarg);
      }
      else if ((cartridgeType == ROM_RAM) || (cartridgeType == ROM_RAM_BATTERY)) {
        fprintf(_stderr,
                "warning: ROM+RAM / ROM+RAM+BATTERY are under-specified and poorly supported\n");
      }
      break;
    case 0x6e:
      if (*musl_optarg == '\0') {
        report("error: Argument to option \'n\' may not be empty\n");
      }
      else {
        if (*musl_optarg == '$') {
          endptr_2 = (char *)strtoul(musl_optarg + 1,(char **)&tmp_1,0x10);
        }
        else {
          endptr_2 = (char *)strtoul(musl_optarg,(char **)&tmp_1,0);
        }
        if (*(char *)tmp_1 == '\0') {
          if (endptr_2 < (char *)0x100) {
            romVersion = (uint16_t)endptr_2;
          }
          else {
            report("error: Argument to option \'n\' is larger than 255: %lu\n",endptr_2);
          }
        }
        else {
          report("error: Expected number as argument to option \'n\', got %s\n",musl_optarg);
        }
      }
      break;
    case 0x70:
      if (*musl_optarg == '\0') {
        report("error: Argument to option \'p\' may not be empty\n");
      }
      else {
        if (*musl_optarg == '$') {
          endptr_3 = (char *)strtoul(musl_optarg + 1,(char **)&tmp_2,0x10);
        }
        else {
          endptr_3 = (char *)strtoul(musl_optarg,(char **)&tmp_2,0);
        }
        if (*(char *)tmp_2 == '\0') {
          if (endptr_3 < (char *)0x100) {
            padValue = (uint16_t)endptr_3;
          }
          else {
            report("error: Argument to option \'p\' is larger than 255: %lu\n",endptr_3);
          }
        }
        else {
          report("error: Expected number as argument to option \'p\', got %s\n",musl_optarg);
        }
      }
      break;
    case 0x72:
      if (*musl_optarg == '\0') {
        report("error: Argument to option \'r\' may not be empty\n");
      }
      else {
        if (*musl_optarg == '$') {
          uStack_68 = strtoul(musl_optarg + 1,(char **)&tmp_3,0x10);
        }
        else {
          uStack_68 = strtoul(musl_optarg,(char **)&tmp_3,0);
        }
        if (*(char *)tmp_3 == '\0') {
          if (uStack_68 < 0x100) {
            ramSize = (uint16_t)uStack_68;
          }
          else {
            report("error: Argument to option \'r\' is larger than 255: %lu\n",uStack_68);
          }
        }
        else {
          report("error: Expected number as argument to option \'r\', got %s\n",musl_optarg);
        }
      }
      break;
    case 0x73:
      sgb = true;
      break;
    case 0x74:
      title = musl_optarg;
      endptr = (char *)strlen(musl_optarg);
      bVar3 = maxTitleLen();
      if ((char *)(ulong)bVar3 < endptr) {
        endptr = (char *)(ulong)bVar3;
        fprintf(_stderr,"warning: Truncating title \"%s\" to %u chars\n",title,(ulong)bVar3);
      }
      titleLen = (uint8_t)endptr;
      break;
    case 0x76:
      fixSpec = 0xa8;
    }
  }
  if (((cartridgeType & 0xff00) == TPP1) && ((japanese & 1U) == 0)) {
    fprintf(_stderr,
            "warning: TPP1 overwrites region flag for its identification code, ignoring `-j`\n");
  }
  pFVar2 = _stderr;
  if ((ramSize != 0x200) && ((cartridgeType & 0xff00) == ROM)) {
    if ((cartridgeType == ROM_RAM) || (cartridgeType == ROM_RAM_BATTERY)) {
      if (ramSize != 1) {
        pcVar5 = mbcName(cartridgeType);
        fprintf(pFVar2,"warning: MBC \"%s\" should have 2 KiB of RAM (-r 1)\n",pcVar5);
      }
    }
    else {
      bVar6 = hasRAM(cartridgeType);
      pFVar2 = _stderr;
      if (bVar6) {
        if (ramSize == 0) {
          pcVar5 = mbcName(cartridgeType);
          fprintf(pFVar2,"warning: MBC \"%s\" has RAM, but RAM size was set to 0\n",pcVar5);
        }
        else if (ramSize == 1) {
          pcVar5 = mbcName(cartridgeType);
          fprintf(pFVar2,"warning: RAM size 1 (2 KiB) was specified for MBC \"%s\"\n",pcVar5);
        }
      }
      else if (ramSize != 0) {
        pcVar5 = mbcName(cartridgeType);
        fprintf(pFVar2,"warning: MBC \"%s\" has no RAM, but RAM size was set to %u\n",pcVar5,
                (ulong)ramSize);
      }
    }
  }
  if ((((sgb & 1U) != 0) && (oldLicensee != 0x200)) && (oldLicensee != 0x33)) {
    fprintf(_stderr,"warning: SGB compatibility enabled, but old licensee is 0x%02x, not 0x33\n",
            (ulong)oldLicensee);
  }
  ppcStack_18 = ppcStack_18 + musl_optind;
  bVar6 = nbErrors != '\0';
  if (*ppcStack_18 == (char *)0x0) {
    fputs("FATAL: Please specify an input file (pass `-` to read from standard input)\n",_stderr);
    printUsage();
    exit(1);
  }
  do {
    bVar4 = processFilename(*ppcStack_18);
    bVar6 = bVar6 || bVar4;
    ppcVar1 = ppcStack_18 + 1;
    ppcStack_18 = ppcStack_18 + 1;
  } while (*ppcVar1 != (char *)0x0);
  return (int)bVar6;
}

Assistant:

int main(int argc, char *argv[])
{
	nbErrors = 0;

	for (int ch; (ch = musl_getopt_long_only(argc, argv, optstring, longopts, NULL)) != -1;) {
		switch (ch) {
			size_t len;
#define parseByte(output, name) \
do { \
	char *endptr; \
	unsigned long tmp; \
	\
	if (musl_optarg[0] == 0) { \
		report("error: Argument to option '" name "' may not be empty\n"); \
	} else { \
		if (musl_optarg[0] == '$') { \
			tmp = strtoul(&musl_optarg[1], &endptr, 16); \
		} else { \
			tmp = strtoul(musl_optarg, &endptr, 0); \
		} \
		if (*endptr) \
			report("error: Expected number as argument to option '" name "', got %s\n", \
			       musl_optarg); \
		else if (tmp > 0xFF) \
			report("error: Argument to option '" name "' is larger than 255: %lu\n", tmp); \
		else \
			output = tmp; \
	} \
} while (0)

		case 'C':
		case 'c':
			model = ch == 'c' ? BOTH : CGB;
			if (titleLen > 15) {
				titleLen = 15;
				fprintf(stderr, "warning: Truncating title \"%s\" to 15 chars\n",
					title);
			}
			break;

		case 'f':
			fixSpec = 0;
			while (*musl_optarg) {
				switch (*musl_optarg) {
#define SPEC_l FIX_LOGO
#define SPEC_L TRASH_LOGO
#define SPEC_h FIX_HEADER_SUM
#define SPEC_H TRASH_HEADER_SUM
#define SPEC_g FIX_GLOBAL_SUM
#define SPEC_G TRASH_GLOBAL_SUM
#define overrideSpec(cur, bad) \
do { \
	if (fixSpec & SPEC_##bad) \
		fprintf(stderr, \
			"warning: '" #cur "' overriding '" #bad "' in fix spec\n"); \
	fixSpec = (fixSpec & ~SPEC_##bad) | SPEC_##cur; \
} while (0)
				case 'l':
					overrideSpec(l, L);
					break;
				case 'L':
					overrideSpec(L, l);
					break;

				case 'h':
					overrideSpec(h, H);
					break;
				case 'H':
					overrideSpec(H, h);
					break;

				case 'g':
					overrideSpec(g, G);
					break;
				case 'G':
					overrideSpec(G, g);
					break;

				default:
					fprintf(stderr, "warning: Ignoring '%c' in fix spec\n",
						*musl_optarg);
#undef overrideSpec
				}
				musl_optarg++;
			}
			break;

		case 'i':
			gameID = musl_optarg;
			len = strlen(gameID);
			if (len > 4) {
				len = 4;
				fprintf(stderr, "warning: Truncating game ID \"%s\" to 4 chars\n",
					gameID);
			}
			gameIDLen = len;
			if (titleLen > 11) {
				titleLen = 11;
				fprintf(stderr, "warning: Truncating title \"%s\" to 11 chars\n",
					title);
			}
			break;

		case 'j':
			japanese = false;
			break;

		case 'k':
			newLicensee = musl_optarg;
			len = strlen(newLicensee);
			if (len > 2) {
				len = 2;
				fprintf(stderr,
					"warning: Truncating new licensee \"%s\" to 2 chars\n",
					newLicensee);
			}
			newLicenseeLen = len;
			break;

		case 'l':
			parseByte(oldLicensee, "l");
			break;

		case 'm':
			cartridgeType = parseMBC(musl_optarg);
			if (cartridgeType == MBC_BAD) {
				report("error: Unknown MBC \"%s\"\nAccepted MBC names:\n",
				       musl_optarg);
				printAcceptedMBCNames();
			} else if (cartridgeType == MBC_WRONG_FEATURES) {
				report("error: Features incompatible with MBC (\"%s\")\nAccepted combinations:\n",
				       musl_optarg);
				printAcceptedMBCNames();
			} else if (cartridgeType == MBC_BAD_RANGE) {
				report("error: Specified MBC ID out of range 0-255: %s\n",
				       musl_optarg);
			} else if (cartridgeType == ROM_RAM || cartridgeType == ROM_RAM_BATTERY) {
				fprintf(stderr, "warning: ROM+RAM / ROM+RAM+BATTERY are under-specified and poorly supported\n");
			}
			break;

		case 'n':
			parseByte(romVersion, "n");
			break;

		case 'O':
			overwriteRom = true;
			break;

		case 'p':
			parseByte(padValue, "p");
			break;

		case 'r':
			parseByte(ramSize, "r");
			break;

		case 's':
			sgb = true;
			break;

		case 't': {
			title = musl_optarg;
			len = strlen(title);
			uint8_t maxLen = maxTitleLen();

			if (len > maxLen) {
				len = maxLen;
				fprintf(stderr, "warning: Truncating title \"%s\" to %u chars\n",
					title, maxLen);
			}
			titleLen = len;
			break;
		}

		case 'V':
			printf("rgbfix %s\n", get_package_version_string());
			exit(0);

		case 'v':
			fixSpec = FIX_LOGO | FIX_HEADER_SUM | FIX_GLOBAL_SUM;
			break;

		default:
			fprintf(stderr, "FATAL: unknown option '%c'\n", ch);
			printUsage();
			exit(1);
		}
#undef parseByte
	}

	if ((cartridgeType & 0xFF00) == TPP1 && !japanese)
		fprintf(stderr, "warning: TPP1 overwrites region flag for its identification code, ignoring `-j`\n");

	// Check that RAM size is correct for "standard" mappers
	if (ramSize != UNSPECIFIED && (cartridgeType & 0xFF00) == 0) {
		if (cartridgeType == ROM_RAM || cartridgeType == ROM_RAM_BATTERY) {
			if (ramSize != 1)
				fprintf(stderr, "warning: MBC \"%s\" should have 2 KiB of RAM (-r 1)\n",
					mbcName(cartridgeType));
		} else if (hasRAM(cartridgeType)) {
			if (!ramSize) {
				fprintf(stderr,
					"warning: MBC \"%s\" has RAM, but RAM size was set to 0\n",
					mbcName(cartridgeType));
			} else if (ramSize == 1) {
				fprintf(stderr,
					"warning: RAM size 1 (2 KiB) was specified for MBC \"%s\"\n",
					mbcName(cartridgeType));
			} // TODO: check possible values?
		} else if (ramSize) {
			fprintf(stderr,
				"warning: MBC \"%s\" has no RAM, but RAM size was set to %u\n",
				mbcName(cartridgeType), ramSize);
		}
	}

	if (sgb && oldLicensee != UNSPECIFIED && oldLicensee != 0x33)
		fprintf(stderr,
			"warning: SGB compatibility enabled, but old licensee is 0x%02x, not 0x33\n",
			oldLicensee);

	argv += musl_optind;
	bool failed = nbErrors;

	if (!*argv) {
		fputs("FATAL: Please specify an input file (pass `-` to read from standard input)\n",
		      stderr);
		printUsage();
		exit(1);
	}

	do {
		failed |= processFilename(*argv);
	} while (*++argv);

	return failed;
}